

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O1

String * Rml::GetFontFaceDescription
                   (String *__return_storage_ptr__,String *font_family,FontStyle style,
                   FontWeight weight)

{
  long *plVar1;
  long *plVar2;
  undefined7 in_register_00000011;
  String font_attributes;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  String local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_c8 = 0;
  local_c0 = 0;
  local_d0 = &local_c0;
  if ((int)CONCAT71(in_register_00000011,style) == 1) {
    ::std::__cxx11::string::append((char *)&local_d0);
  }
  if (weight != Auto) {
    if (weight != Normal) {
      if (weight == Bold) {
        ::std::__cxx11::string::append((char *)&local_d0);
      }
      else {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50);
        FormatString(&local_b0,"%d",(ulong)weight);
        plVar1 = (long *)::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x2d471b);
        plVar2 = plVar1 + 2;
        if ((long *)*plVar1 == plVar2) {
          local_60 = *plVar2;
          lStack_58 = plVar1[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar2;
          local_70 = (long *)*plVar1;
        }
        local_68 = plVar1[1];
        *plVar1 = (long)plVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)::std::__cxx11::string::append((char *)&local_70);
        plVar2 = plVar1 + 2;
        if ((long *)*plVar1 == plVar2) {
          local_80 = *plVar2;
          lStack_78 = plVar1[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar2;
          local_90 = (long *)*plVar1;
        }
        local_88 = plVar1[1];
        *plVar1 = (long)plVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
      }
    }
  }
  if (local_c8 == 0) {
    ::std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)0x0,0x2d4723);
  }
  else {
    ::std::__cxx11::string::resize((ulong)&local_d0,(char)local_c8 + -2);
  }
  CreateString_abi_cxx11_
            (__return_storage_ptr__,"\'%s\' [%s]",(font_family->_M_dataplus)._M_p,local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String GetFontFaceDescription(const String& font_family, Style::FontStyle style, Style::FontWeight weight)
{
	String font_attributes;

	if (style == Style::FontStyle::Italic)
		font_attributes += "italic, ";
	if (weight == Style::FontWeight::Bold)
		font_attributes += "bold, ";
	else if (weight != Style::FontWeight::Auto && weight != Style::FontWeight::Normal)
		font_attributes += "weight=" + ToString((int)weight) + ", ";

	if (font_attributes.empty())
		font_attributes = "regular";
	else
		font_attributes.resize(font_attributes.size() - 2);

	return CreateString("'%s' [%s]", font_family.c_str(), font_attributes.c_str());
}